

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalPivot::Deserialize(LogicalPivot *this,Deserializer *deserializer)

{
  LogicalPivot *this_00;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalPivot_*,_false> local_20;
  
  this_00 = (LogicalPivot *)operator_new(0xc0);
  LogicalPivot(this_00);
  local_20._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>::
           operator->((unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,200,"pivot_index",&pLVar1->pivot_index);
  pLVar1 = unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>::
           operator->((unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::BoundPivotInfo>
            (deserializer,0xc9,"bound_pivot",&pLVar1->bound_pivot);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalPivot::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalPivot>(new LogicalPivot());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "pivot_index", result->pivot_index);
	deserializer.ReadProperty<BoundPivotInfo>(201, "bound_pivot", result->bound_pivot);
	return std::move(result);
}